

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O1

void Curl_pgrsTime(Curl_easy *data,timerid timer)

{
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  time_t tVar6;
  timediff_t tVar7;
  long lVar8;
  int iVar9;
  time_t *ptVar10;
  curltime cVar11;
  curltime newer;
  curltime older;
  curltime older_00;
  
  cVar11 = Curl_now();
  tVar6 = cVar11.tv_sec;
  iVar9 = cVar11.tv_usec;
  ptVar10 = (time_t *)0x0;
  auVar1 = cVar11._0_12_;
  switch(timer) {
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = tVar6;
    (data->progress).t_startop.tv_usec = iVar9;
    goto LAB_0010c4c6;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = tVar6;
    (data->progress).t_startsingle.tv_usec = iVar9;
    (data->progress).is_t_startransfer_set = false;
    goto LAB_0010c4c6;
  case TIMER_NAMELOOKUP:
    ptVar10 = &(data->progress).t_nslookup;
    break;
  case TIMER_CONNECT:
    ptVar10 = &(data->progress).t_connect;
    break;
  case TIMER_APPCONNECT:
    ptVar10 = &(data->progress).t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    ptVar10 = &(data->progress).t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    if ((data->progress).is_t_startransfer_set != false) {
      return;
    }
    ptVar10 = &(data->progress).t_starttransfer;
    (data->progress).is_t_startransfer_set = true;
    break;
  case TIMER_STARTACCEPT:
    (data->progress).t_acceptdata.tv_sec = tVar6;
    (data->progress).t_acceptdata.tv_usec = iVar9;
    goto LAB_0010c4c6;
  case TIMER_REDIRECT:
    uVar2 = (data->progress).start.tv_sec;
    uVar3 = (data->progress).start.tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    cVar11._12_4_ = 0;
    cVar11.tv_sec = auVar1._0_8_;
    cVar11.tv_usec = auVar1._8_4_;
    older._12_4_ = 0;
    tVar7 = Curl_timediff_us(cVar11,older);
    (data->progress).t_redirect = tVar7;
LAB_0010c4c6:
    ptVar10 = (time_t *)0x0;
  }
  if (ptVar10 != (time_t *)0x0) {
    uVar4 = (data->progress).t_startsingle.tv_sec;
    uVar5 = (data->progress).t_startsingle.tv_usec;
    older_00.tv_usec = uVar5;
    older_00.tv_sec = uVar4;
    newer._12_4_ = 0;
    newer.tv_sec = auVar1._0_8_;
    newer.tv_usec = auVar1._8_4_;
    older_00._12_4_ = 0;
    tVar7 = Curl_timediff_us(newer,older_00);
    lVar8 = 1;
    if (1 < tVar7) {
      lVar8 = tVar7;
    }
    *ptVar10 = *ptVar10 + lVar8;
  }
  return;
}

Assistant:

void Curl_pgrsTime(struct Curl_easy *data, timerid timer)
{
  struct curltime now = Curl_now();
  time_t *delta = NULL;

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = now;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single fetch */
    data->progress.t_startsingle = now;
    data->progress.is_t_startransfer_set = false;
    break;
  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = now;
    break;
  case TIMER_NAMELOOKUP:
    delta = &data->progress.t_nslookup;
    break;
  case TIMER_CONNECT:
    delta = &data->progress.t_connect;
    break;
  case TIMER_APPCONNECT:
    delta = &data->progress.t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    delta = &data->progress.t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    delta = &data->progress.t_starttransfer;
    /* prevent updating t_starttransfer unless:
     *   1) this is the first time we're setting t_starttransfer
     *   2) a redirect has occurred since the last time t_starttransfer was set
     * This prevents repeated invocations of the function from incorrectly
     * changing the t_starttransfer time.
     */
    if(data->progress.is_t_startransfer_set) {
      return;
    }
    else {
      data->progress.is_t_startransfer_set = true;
      break;
    }
  case TIMER_POSTRANSFER:
    /* this is the normal end-of-transfer thing */
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_timediff_us(now, data->progress.start);
    break;
  }
  if(delta) {
    timediff_t us = Curl_timediff_us(now, data->progress.t_startsingle);
    if(us < 1)
      us = 1; /* make sure at least one microsecond passed */
    *delta += us;
  }
}